

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

Matrix * __thiscall
QPDFPageObjectHelper::getMatrixForTransformations
          (Matrix *__return_storage_ptr__,QPDFPageObjectHelper *this,bool invert)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  Rectangle rect;
  QPDFObjectHandle scale_obj;
  QPDFObjectHandle rotate_obj;
  QPDFObjectHandle bbox;
  double local_98;
  Rectangle local_88;
  undefined1 local_68 [24];
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *peStack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  __return_storage_ptr__->a = 1.0;
  __return_storage_ptr__->b = 0.0;
  __return_storage_ptr__->c = 0.0;
  __return_storage_ptr__->d = 1.0;
  __return_storage_ptr__->e = 0.0;
  __return_storage_ptr__->f = 0.0;
  getTrimBox((QPDFPageObjectHelper *)&stack0xffffffffffffffd0,SUB81(this,0),false);
  bVar2 = QPDFObjectHandle::isRectangle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if (!bVar2) goto LAB_001d70b6;
  pdVar1 = &local_88.urx;
  local_88.llx = (double)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Rotate","");
  getAttribute((QPDFPageObjectHelper *)(local_68 + 0x10),(string *)this,SUB81(&local_88,0));
  if ((double *)local_88.llx != pdVar1) {
    operator_delete((void *)local_88.llx,(long)local_88.urx + 1);
  }
  local_88.llx = (double)pdVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/UserUnit","");
  getAttribute((QPDFPageObjectHelper *)local_68,(string *)this,SUB81(&local_88,0));
  if ((double *)local_88.llx != pdVar1) {
    operator_delete((void *)local_88.llx,(long)local_88.urx + 1);
  }
  bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)(local_68 + 0x10));
  if (bVar2) {
    bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_68);
    if (!bVar2) goto LAB_001d6f08;
  }
  else {
LAB_001d6f08:
    QPDFObjectHandle::getArrayAsRectangle(&local_88,(QPDFObjectHandle *)&stack0xffffffffffffffd0);
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88.urx - local_88.llx);
    peStack_40 = (element_type *)(local_88.ury - local_88.lly);
    bVar2 = QPDFObjectHandle::isNumber((QPDFObjectHandle *)local_68);
    if (bVar2) {
      local_98 = QPDFObjectHandle::getNumericValue((QPDFObjectHandle *)local_68);
    }
    else {
      local_98 = 1.0;
    }
    bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)(local_68 + 0x10));
    iVar3 = 0;
    if (bVar2) {
      iVar3 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)(local_68 + 0x10));
    }
    if (invert) {
      if ((local_98 == 0.0) && (!NAN(local_98))) goto LAB_001d7098;
      local_98 = 1.0 / local_98;
      iVar3 = 0x168 - iVar3;
    }
    if (iVar3 == 0x10e) {
      __return_storage_ptr__->a = 0.0;
      __return_storage_ptr__->b = local_98;
      __return_storage_ptr__->c = -local_98;
      __return_storage_ptr__->d = 0.0;
      __return_storage_ptr__->e = (double)peStack_40 * local_98;
      __return_storage_ptr__->f = 0.0;
    }
    else if (iVar3 == 0xb4) {
      __return_storage_ptr__->a = -local_98;
      __return_storage_ptr__->b = 0.0;
      __return_storage_ptr__->c = 0.0;
      __return_storage_ptr__->d = -local_98;
      __return_storage_ptr__->e = (double)local_48._M_pi * local_98;
      __return_storage_ptr__->f = (double)peStack_40 * local_98;
    }
    else if (iVar3 == 0x5a) {
      __return_storage_ptr__->a = 0.0;
      __return_storage_ptr__->b = -local_98;
      __return_storage_ptr__->c = local_98;
      __return_storage_ptr__->d = 0.0;
      __return_storage_ptr__->e = 0.0;
      __return_storage_ptr__->f = (double)local_48._M_pi * local_98;
    }
    else {
      __return_storage_ptr__->a = local_98;
      __return_storage_ptr__->b = 0.0;
      __return_storage_ptr__->c = 0.0;
      __return_storage_ptr__->d = local_98;
      __return_storage_ptr__->e = 0.0;
      __return_storage_ptr__->f = 0.0;
    }
  }
LAB_001d7098:
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  if (local_50 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50);
  }
LAB_001d70b6:
  if ((element_type *)local_28._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Matrix
QPDFPageObjectHelper::getMatrixForTransformations(bool invert)
{
    QPDFObjectHandle::Matrix matrix(1, 0, 0, 1, 0, 0);
    QPDFObjectHandle bbox = getTrimBox(false);
    if (!bbox.isRectangle()) {
        return matrix;
    }
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    QPDFObjectHandle scale_obj = getAttribute("/UserUnit", false);
    if (!(rotate_obj.isNull() && scale_obj.isNull())) {
        QPDFObjectHandle::Rectangle rect = bbox.getArrayAsRectangle();
        double width = rect.urx - rect.llx;
        double height = rect.ury - rect.lly;
        double scale = (scale_obj.isNumber() ? scale_obj.getNumericValue() : 1.0);
        int rotate = (rotate_obj.isInteger() ? rotate_obj.getIntValueAsInt() : 0);
        if (invert) {
            if (scale == 0.0) {
                return matrix;
            }
            scale = 1.0 / scale;
            rotate = 360 - rotate;
        }

        // Ignore invalid rotation angle
        switch (rotate) {
        case 90:
            matrix = QPDFObjectHandle::Matrix(0, -scale, scale, 0, 0, width * scale);
            break;
        case 180:
            matrix = QPDFObjectHandle::Matrix(-scale, 0, 0, -scale, width * scale, height * scale);
            break;
        case 270:
            matrix = QPDFObjectHandle::Matrix(0, scale, -scale, 0, height * scale, 0);
            break;
        default:
            matrix = QPDFObjectHandle::Matrix(scale, 0, 0, scale, 0, 0);
            break;
        }
    }
    return matrix;
}